

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_object.c
# Opt level: O0

void lu_clear_lhs(basiclu_object *obj)

{
  int iVar1;
  int iVar2;
  long in_RDI;
  lu_int p;
  lu_int nz;
  lu_int nzsparse;
  lu_int m;
  undefined4 local_18;
  
  iVar2 = (int)*(double *)(*(long *)(in_RDI + 8) + 0x200);
  iVar1 = *(int *)(in_RDI + 0x50);
  if (iVar1 != 0) {
    if ((int)(*(double *)(*(long *)(in_RDI + 8) + 0x60) * (double)iVar2) < iVar1) {
      memset(*(void **)(in_RDI + 0x40),0,(long)iVar2 << 3);
    }
    else {
      for (local_18 = 0; local_18 < iVar1; local_18 = local_18 + 1) {
        *(undefined8 *)
         (*(long *)(in_RDI + 0x40) +
         (long)*(int *)(*(long *)(in_RDI + 0x48) + (long)local_18 * 4) * 8) = 0;
      }
    }
    *(undefined4 *)(in_RDI + 0x50) = 0;
  }
  return;
}

Assistant:

static void lu_clear_lhs(struct basiclu_object *obj)
{
    lu_int m = obj->xstore[BASICLU_DIM];
    lu_int nzsparse = obj->xstore[BASICLU_SPARSE_THRESHOLD] * m;
    lu_int nz = obj->nzlhs;
    lu_int p;

    if (nz)
    {
        if (nz <= nzsparse)
            for (p = 0; p < nz; p++)
                obj->lhs[obj->ilhs[p]] = 0;
        else
            memset(obj->lhs, 0, m*sizeof(double));
        obj->nzlhs = 0;
    }
}